

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void initScene(scene_t *scene)

{
  GLuint *pGVar1;
  undefined8 *puVar2;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  byte bVar5;
  byte *pbVar6;
  yo_env *pyVar7;
  int *piVar8;
  float *pfVar9;
  float *pfVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  yo__vec2f yVar14;
  void *__n_00;
  yo__vert vl;
  yo__vert v_00;
  yo__vert vl_00;
  yo__vert v_01;
  yo__vert vl_01;
  yo__vert v_02;
  undefined4 uVar15;
  char **vp;
  string sVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  GLuint GVar23;
  GLint GVar24;
  yo_scene *scene_00;
  yo__vhash *vhash;
  yo_shape *pyVar25;
  FILE *__stream;
  char *pcVar26;
  yo_scene *pyVar27;
  long lVar28;
  yo_texture *pyVar29;
  yo_camera *pyVar30;
  yo_material *pyVar31;
  vec3f *positions;
  void *pvVar32;
  vec3f *normal;
  void *__src;
  int *piVar33;
  int *sphcnt;
  float *LHbuffer;
  long lVar34;
  void *pvVar35;
  long *plVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  yo_shape *pyVar41;
  long *plVar42;
  size_type *psVar43;
  char **ppcVar44;
  uint uVar45;
  char *basename;
  undefined8 *puVar46;
  bool bVar47;
  bool bVar48;
  long lVar49;
  uint uVar50;
  char *dirname;
  size_t sVar51;
  yo__vec3f *in_R8;
  float *in_R9;
  ulong uVar52;
  byte *pbVar53;
  ulong uVar54;
  int t;
  int iVar55;
  long lVar56;
  ulong uVar57;
  byte *pbVar58;
  undefined8 uVar59;
  yo__vert v_1;
  string __str_1;
  yo__vert v_2;
  yo__vert v;
  string __str_2;
  SphereTree hierarchy;
  char *paths [12];
  string N_ZEROS;
  string vert_head;
  ulong local_4210;
  yo_shape *local_4208;
  yo__vec2f *local_4200;
  ulong local_41e8;
  ulong local_41d0;
  yo__vec3f *local_41c8;
  yo__vec3f *local_41c0;
  undefined4 *local_41a8;
  uint uStack_41a0;
  undefined4 uStack_419c;
  undefined4 uStack_4198;
  undefined4 uStack_4194;
  long lStack_4190;
  int *local_4188 [2];
  int local_4178;
  int iStack_4174;
  undefined8 uStack_4170;
  undefined4 *local_4168;
  uint uStack_4160;
  undefined4 uStack_415c;
  undefined4 uStack_4158;
  undefined4 uStack_4154;
  string local_4148;
  undefined4 *local_4128;
  uint uStack_4120;
  undefined4 uStack_411c;
  undefined4 uStack_4118;
  undefined4 uStack_4114;
  long lStack_4110;
  yo__vert local_4108;
  long lStack_40f0;
  ulong *local_40e8;
  long local_40e0;
  ulong local_40d8 [2];
  string local_40c8;
  int *local_40a8;
  int *local_40a0;
  int *local_4098;
  int *local_4090;
  int *local_4088;
  int *local_4080;
  int *local_4078;
  int *local_4070;
  SphereTree local_4060;
  char **local_4038;
  char *local_4030;
  char *local_4028;
  char *pcStack_4020;
  char *local_4018;
  char *local_4010;
  char *local_4008;
  char *local_4000;
  char *local_3ff8;
  char *local_3ff0;
  char *local_3fe8;
  char *local_3fe0;
  undefined8 local_3038;
  char *local_3030 [4];
  char *local_3010;
  char *local_3008;
  char *local_3000;
  char *local_2ff8;
  char *local_2ff0;
  char local_1039;
  undefined8 local_1038;
  long local_1030;
  long local_1028;
  long lStack_1020;
  
  load_sphere_hierarchy(&local_4060,"../res/scene1/scene1.sph");
  buildLHcubemap("../res/null.shrgb");
  loadlut(3,&(scene->mesh).max_magn);
  build_sh_lut();
  iVar18 = upload_gamma(0xf);
  (scene->mesh).gammasize = iVar18;
  iVar18 = upload_sqrgamma(0xf);
  (scene->mesh).sqrgammasize = iVar18;
  github111116::ConsoleLogger::log<char[12],int>
            (&console,(char (*) [12])0x199d81,&(scene->mesh).gammasize);
  github111116::ConsoleLogger::log<char[15],int>
            (&console,(char (*) [15])"sqrgamma size:",&(scene->mesh).sqrgammasize);
  github111116::ConsoleLogger::log<char[17]>(&console,(char (*) [17])"loading scene...");
  scene_00 = (yo_scene *)calloc(1,0x50);
  vhash = (yo__vhash *)calloc(1,0xc00008);
  uVar38 = scene_00->nshapes;
  if (uVar38 == 0xffffffff) {
    pyVar41 = (yo_shape *)0x0;
LAB_0015d9af:
    uVar37 = uVar38 - 1 >> 1 | uVar38 - 1;
    uVar37 = uVar37 >> 2 | uVar37;
    uVar37 = uVar37 >> 4 | uVar37;
    uVar37 = uVar37 >> 8 | uVar37;
    if ((int)((uVar37 >> 0x10 | uVar37) + 1) < (int)pyVar41) goto LAB_0015d9de;
  }
  else {
    if (uVar38 != 0) {
      uVar37 = uVar38 >> 1 | uVar38;
      uVar37 = uVar37 >> 2 | uVar37;
      uVar37 = uVar37 >> 4 | uVar37;
      uVar37 = uVar37 >> 8 | uVar37;
      pyVar41 = (yo_shape *)(ulong)((uVar37 >> 0x10 | uVar37) + 1);
      goto LAB_0015d9af;
    }
LAB_0015d9de:
    iVar18 = 0;
    if (uVar38 == 0xffffffff) {
      sVar51 = 0;
    }
    else {
      uVar38 = uVar38 >> 1 | uVar38;
      uVar38 = uVar38 >> 2 | uVar38;
      uVar38 = uVar38 >> 4 | uVar38;
      uVar38 = uVar38 >> 8 | uVar38;
      sVar51 = (long)(int)((uVar38 >> 0x10 | uVar38) + 1) * 0x60;
    }
    pyVar25 = (yo_shape *)realloc(scene_00->shapes,sVar51);
    scene_00->shapes = pyVar25;
    uVar38 = scene_00->nshapes;
    pyVar41 = (yo_shape *)(long)(int)uVar38;
    if (pyVar41 != (yo_shape *)0xffffffffffffffff) {
      uVar37 = uVar38 >> 1 | uVar38;
      uVar37 = uVar37 >> 2 | uVar37;
      uVar37 = uVar37 >> 4 | uVar37;
      uVar37 = uVar37 >> 8 | uVar37;
      iVar18 = (uVar37 >> 0x10 | uVar37) + 1;
    }
    memset(pyVar25 + (long)pyVar41,0,(long)(int)(iVar18 - uVar38) * 0x60);
  }
  iVar18 = scene_00->nshapes;
  scene_00->nshapes = iVar18 + 1;
  local_4208 = scene_00->shapes;
  __stream = fopen("../res/scene1/scene1.obj","rt");
  if (__stream == (FILE *)0x0) {
LAB_0015e940:
    scene_00 = (yo_scene *)0x0;
  }
  else {
    pcVar26 = fgets((char *)&local_1038,0x1000,__stream);
    local_4210 = 0;
    if (pcVar26 == (char *)0x0) {
      local_4200 = (yo__vec2f *)0x0;
      local_41c8 = (yo__vec3f *)0x0;
      local_41c0 = (yo__vec3f *)0x0;
    }
    else {
      local_4208 = local_4208 + iVar18;
      local_41e8 = 0;
      local_41d0 = 0;
      local_41c0 = (yo__vec3f *)0x0;
      local_41c8 = (yo__vec3f *)0x0;
      local_4200 = (yo__vec2f *)0x0;
      do {
        uVar52 = 0;
        if (local_1038._0_1_ != (string)0x0) {
          puVar46 = &local_1038;
          sVar16 = local_1038._0_1_;
          do {
            iVar18 = isspace((int)(char)sVar16);
            if (iVar18 == 0) {
              iVar18 = (int)uVar52;
              if ((iVar18 == 0) || (*(char *)((long)puVar46 + -1) == '\0')) {
                (&local_3038)[iVar18] = puVar46;
                uVar52 = (ulong)(iVar18 + 1);
              }
            }
            else {
              *(undefined1 *)puVar46 = 0;
            }
            sVar16 = *(string *)((long)puVar46 + 1);
          } while ((sVar16 != (string)0x0) &&
                  (puVar46 = (undefined8 *)((long)puVar46 + 1), (int)uVar52 < 0x400));
        }
        pcVar26 = (char *)local_3038;
        iVar18 = (int)uVar52;
        bVar48 = false;
        if ((iVar18 != 0) && (*(char *)local_3038 != '#')) {
          iVar19 = strcmp((char *)local_3038,"v");
          uVar38 = (uint)local_4210;
          if (iVar19 == 0) {
            dVar11 = atof(local_3030[0]);
            dVar12 = atof(local_3030[1]);
            dVar13 = atof(local_3030[2]);
            if (uVar38 == 0xffffffff) {
              iVar18 = 0;
LAB_0015de76:
              uVar37 = uVar38 - 1 >> 1 | uVar38 - 1;
              uVar37 = uVar37 >> 2 | uVar37;
              uVar37 = uVar37 >> 4 | uVar37;
              uVar37 = uVar37 >> 8 | uVar37;
              if ((int)((uVar37 >> 0x10 | uVar37) + 1) < iVar18) {
                if (uVar38 != 0xffffffff) goto LAB_0015deaa;
                sVar51 = 0;
                goto LAB_0015dede;
              }
            }
            else {
              if (uVar38 != 0) {
                uVar37 = (uint)(local_4210 >> 1) | uVar38;
                uVar37 = uVar37 >> 2 | uVar37;
                uVar37 = uVar37 >> 4 | uVar37;
                uVar37 = uVar37 >> 8 | uVar37;
                iVar18 = (uVar37 >> 0x10 | uVar37) + 1;
                goto LAB_0015de76;
              }
LAB_0015deaa:
              uVar37 = (uint)(local_4210 >> 1) | uVar38;
              uVar37 = uVar37 >> 2 | uVar37;
              uVar37 = uVar37 >> 4 | uVar37;
              uVar37 = uVar37 >> 8 | uVar37;
              sVar51 = (long)(int)((uVar37 >> 0x10 | uVar37) + 1) * 0xc;
LAB_0015dede:
              local_41c0 = (yo__vec3f *)realloc(local_41c0,sVar51);
            }
            pyVar41 = (yo_shape *)(long)(int)uVar38;
            local_41c0[(long)pyVar41].x = (float)dVar11;
            local_41c0[(long)pyVar41].y = (float)dVar12;
            local_41c0[(long)pyVar41].z = (float)dVar13;
            local_4210 = (ulong)(uVar38 + 1);
          }
          else {
            iVar19 = strcmp(pcVar26,"vt");
            uVar37 = (uint)local_41e8;
            if (iVar19 == 0) {
              dVar11 = atof(local_3030[0]);
              dVar12 = atof(local_3030[1]);
              if (uVar37 == 0xffffffff) {
                iVar18 = 0;
LAB_0015df34:
                uVar38 = uVar37 - 1 >> 1 | uVar37 - 1;
                uVar38 = uVar38 >> 2 | uVar38;
                uVar38 = uVar38 >> 4 | uVar38;
                uVar38 = uVar38 >> 8 | uVar38;
                if ((int)((uVar38 >> 0x10 | uVar38) + 1) < iVar18) {
                  if (uVar37 != 0xffffffff) goto LAB_0015df68;
                  sVar51 = 0;
                  goto LAB_0015df99;
                }
              }
              else {
                if (uVar37 != 0) {
                  uVar38 = (uint)(local_41e8 >> 1) | uVar37;
                  uVar38 = uVar38 >> 2 | uVar38;
                  uVar38 = uVar38 >> 4 | uVar38;
                  uVar38 = uVar38 >> 8 | uVar38;
                  iVar18 = (uVar38 >> 0x10 | uVar38) + 1;
                  goto LAB_0015df34;
                }
LAB_0015df68:
                uVar38 = (uint)(local_41e8 >> 1) | uVar37;
                uVar38 = uVar38 >> 2 | uVar38;
                uVar38 = uVar38 >> 4 | uVar38;
                uVar38 = uVar38 >> 8 | uVar38;
                sVar51 = (long)(int)((uVar38 >> 0x10 | uVar38) + 1) << 3;
LAB_0015df99:
                local_4200 = (yo__vec2f *)realloc(local_4200,sVar51);
              }
              pyVar41 = (yo_shape *)(long)(int)uVar37;
              yVar14.y = (float)dVar12;
              yVar14.x = (float)dVar11;
              local_4200[(long)pyVar41] = yVar14;
              local_41e8 = (ulong)(uVar37 + 1);
              bVar48 = false;
              goto LAB_0015e097;
            }
            iVar19 = strcmp(pcVar26,"vn");
            uVar50 = (uint)local_41d0;
            if (iVar19 != 0) {
              iVar19 = strcmp(pcVar26,"vc");
              bVar48 = false;
              bVar47 = false;
              if ((((iVar19 != 0) && (iVar19 = strcmp(pcVar26,"vr"), iVar19 != 0)) &&
                  (iVar19 = strcmp(pcVar26,"xf"), iVar19 != 0)) &&
                 ((iVar19 = strcmp(pcVar26,"c"), bVar48 = bVar47, iVar19 != 0 &&
                  (iVar19 = strcmp(pcVar26,"e"), iVar19 != 0)))) {
                iVar19 = strcmp(pcVar26,"f");
                if (iVar19 == 0) {
                  if (local_4208->etype != 3) {
                    local_4208 = yo__flush_shape(scene_00,vhash);
                  }
                  local_4208->etype = 3;
                  if (1 < iVar18) {
                    uVar20 = 0;
                    uVar54 = 1;
                    do {
                      local_4128 = (undefined4 *)CONCAT44(uVar37,uVar38);
                      uStack_411c = 0;
                      uStack_4118 = 0;
                      uStack_4114 = 0;
                      vl.norm = (undefined4)local_41d0;
                      vl.color = local_41d0._4_4_;
                      vl._0_8_ = local_4128;
                      vl.radius = 0;
                      vl.vid = 0;
                      uStack_4120 = uVar50;
                      yo__parse_vert((yo__vert *)&local_4148,(char *)(&local_3038)[uVar54],vhash,vl)
                      ;
                      v_00.norm = (undefined4)local_4148._M_string_length;
                      v_00.color = local_4148._M_string_length._4_4_;
                      v_00._0_8_ = local_4148._M_dataplus._M_p;
                      v_00.radius = local_4148.field_2._M_allocated_capacity._0_4_;
                      v_00.vid = local_4148.field_2._M_allocated_capacity._4_4_;
                      yo__add_shape_vert(local_4208,v_00,local_41c0,local_41c8,local_4200,in_R8,
                                         in_R9);
                      uVar15 = local_4148.field_2._M_allocated_capacity._4_4_;
                      if (uVar54 == 1) {
                        uVar20 = local_4148.field_2._M_allocated_capacity._4_4_;
                      }
                      if (3 < uVar54) {
                        uVar40 = local_4208->nelems;
                        iVar18 = local_4208->elem[(long)(int)uVar40 + -1];
                        if ((long)(int)uVar40 == -1) {
                          iVar19 = 0;
LAB_0015e23c:
                          uVar39 = uVar40 - 1 >> 1 | uVar40 - 1;
                          uVar39 = uVar39 >> 2 | uVar39;
                          uVar39 = uVar39 >> 4 | uVar39;
                          uVar39 = uVar39 >> 8 | uVar39;
                          if ((int)((uVar39 >> 0x10 | uVar39) + 1) < iVar19) {
                            if (uVar40 != 0xffffffff) goto LAB_0015e270;
                            sVar51 = 0;
                            goto LAB_0015e29b;
                          }
                        }
                        else {
                          if (uVar40 != 0) {
                            uVar39 = uVar40 >> 1 | uVar40;
                            uVar39 = uVar39 >> 2 | uVar39;
                            uVar39 = uVar39 >> 4 | uVar39;
                            uVar39 = uVar39 >> 8 | uVar39;
                            iVar19 = (uVar39 >> 0x10 | uVar39) + 1;
                            goto LAB_0015e23c;
                          }
LAB_0015e270:
                          uVar40 = uVar40 >> 1 | uVar40;
                          uVar40 = uVar40 >> 2 | uVar40;
                          uVar40 = uVar40 >> 4 | uVar40;
                          uVar40 = uVar40 >> 8 | uVar40;
                          sVar51 = (long)(int)((uVar40 >> 0x10 | uVar40) + 1) << 2;
LAB_0015e29b:
                          piVar33 = (int *)realloc(local_4208->elem,sVar51);
                          local_4208->elem = piVar33;
                        }
                        piVar33 = local_4208->elem;
                        piVar33[local_4208->nelems] = uVar20;
                        uVar40 = local_4208->nelems;
                        uVar39 = uVar40 + 1;
                        local_4208->nelems = uVar39;
                        if (uVar39 == 0) {
LAB_0015e326:
                          if (uVar40 == 0xfffffffe) {
                            sVar51 = 0;
                          }
                          else {
                            uVar39 = uVar39 >> 1 | uVar39;
                            uVar39 = uVar39 >> 2 | uVar39;
                            uVar39 = uVar39 >> 4 | uVar39;
                            uVar39 = uVar39 >> 8 | uVar39;
                            sVar51 = (long)(int)((uVar39 >> 0x10 | uVar39) + 1) << 2;
                          }
                          piVar33 = (int *)realloc(piVar33,sVar51);
                          local_4208->elem = piVar33;
                        }
                        else {
                          iVar19 = 0;
                          if (uVar40 != 0xfffffffe) {
                            uVar45 = uVar39 >> 1 | uVar39;
                            uVar45 = uVar45 >> 2 | uVar45;
                            uVar45 = uVar45 >> 4 | uVar45;
                            uVar45 = uVar45 >> 8 | uVar45;
                            iVar19 = (uVar45 >> 0x10 | uVar45) + 1;
                          }
                          uVar45 = uVar40 >> 1 | uVar40;
                          uVar45 = uVar45 >> 2 | uVar45;
                          uVar45 = uVar45 >> 4 | uVar45;
                          uVar45 = uVar45 >> 8 | uVar45;
                          in_R8 = (yo__vec3f *)(ulong)uVar45;
                          if ((int)((uVar45 >> 0x10 | uVar45) + 1) < iVar19) goto LAB_0015e326;
                        }
                        local_4208->elem[local_4208->nelems] = iVar18;
                        local_4208->nelems = local_4208->nelems + 1;
                      }
                      uVar40 = local_4208->nelems;
                      if (uVar40 == 0xffffffff) {
                        iVar18 = 0;
LAB_0015e3b7:
                        uVar39 = uVar40 - 1 >> 1 | uVar40 - 1;
                        uVar39 = uVar39 >> 2 | uVar39;
                        uVar39 = uVar39 >> 4 | uVar39;
                        uVar39 = uVar39 >> 8 | uVar39;
                        if ((int)((uVar39 >> 0x10 | uVar39) + 1) < iVar18) goto LAB_0015e3e2;
                      }
                      else {
                        if (uVar40 != 0) {
                          uVar39 = uVar40 >> 1 | uVar40;
                          uVar39 = uVar39 >> 2 | uVar39;
                          uVar39 = uVar39 >> 4 | uVar39;
                          uVar39 = uVar39 >> 8 | uVar39;
                          iVar18 = (uVar39 >> 0x10 | uVar39) + 1;
                          goto LAB_0015e3b7;
                        }
LAB_0015e3e2:
                        if (uVar40 == 0xffffffff) {
                          sVar51 = 0;
                        }
                        else {
                          uVar40 = uVar40 >> 1 | uVar40;
                          uVar40 = uVar40 >> 2 | uVar40;
                          uVar40 = uVar40 >> 4 | uVar40;
                          uVar40 = uVar40 >> 8 | uVar40;
                          sVar51 = (long)(int)((uVar40 >> 0x10 | uVar40) + 1) << 2;
                        }
                        piVar33 = (int *)realloc(local_4208->elem,sVar51);
                        local_4208->elem = piVar33;
                      }
                      pyVar41 = (yo_shape *)(long)local_4208->nelems;
                      local_4208->elem[(long)pyVar41] = uVar15;
                      local_4208->nelems = local_4208->nelems + 1;
                      uVar54 = uVar54 + 1;
                      bVar48 = false;
                    } while (uVar52 != uVar54);
                  }
                }
                else {
                  iVar19 = strcmp(pcVar26,"l");
                  if (iVar19 == 0) {
                    if (local_4208->etype != 2) {
                      local_4208 = yo__flush_shape(scene_00,vhash);
                    }
                    local_4208->etype = 2;
                    if (1 < iVar18) {
                      uVar54 = 1;
                      do {
                        local_41a8 = (undefined4 *)CONCAT44(uVar37,uVar38);
                        uStack_419c = 0;
                        uStack_4198 = 0;
                        uStack_4194 = 0;
                        vl_00.norm = (undefined4)local_41d0;
                        vl_00.color = local_41d0._4_4_;
                        vl_00._0_8_ = local_41a8;
                        vl_00.radius = 0;
                        vl_00.vid = 0;
                        uStack_41a0 = uVar50;
                        yo__parse_vert((yo__vert *)local_4188,(char *)(&local_3038)[uVar54],vhash,
                                       vl_00);
                        v_01._8_8_ = local_4188[1];
                        v_01._0_8_ = local_4188[0];
                        v_01.radius = local_4178;
                        v_01.vid = iStack_4174;
                        yo__add_shape_vert(local_4208,v_01,local_41c0,local_41c8,local_4200,in_R8,
                                           in_R9);
                        if (2 < uVar54) {
                          uVar40 = local_4208->nelems;
                          iVar18 = local_4208->elem[(long)(int)uVar40 + -1];
                          if ((long)(int)uVar40 == -1) {
                            iVar19 = 0;
LAB_0015e57a:
                            uVar39 = uVar40 - 1 >> 1 | uVar40 - 1;
                            uVar39 = uVar39 >> 2 | uVar39;
                            uVar39 = uVar39 >> 4 | uVar39;
                            uVar39 = uVar39 >> 8 | uVar39;
                            if ((int)((uVar39 >> 0x10 | uVar39) + 1) < iVar19) {
                              if (uVar40 != 0xffffffff) goto LAB_0015e5ae;
                              sVar51 = 0;
                              goto LAB_0015e5d9;
                            }
                          }
                          else {
                            if (uVar40 != 0) {
                              uVar39 = uVar40 >> 1 | uVar40;
                              uVar39 = uVar39 >> 2 | uVar39;
                              uVar39 = uVar39 >> 4 | uVar39;
                              uVar39 = uVar39 >> 8 | uVar39;
                              iVar19 = (uVar39 >> 0x10 | uVar39) + 1;
                              goto LAB_0015e57a;
                            }
LAB_0015e5ae:
                            uVar40 = uVar40 >> 1 | uVar40;
                            uVar40 = uVar40 >> 2 | uVar40;
                            uVar40 = uVar40 >> 4 | uVar40;
                            uVar40 = uVar40 >> 8 | uVar40;
                            sVar51 = (long)(int)((uVar40 >> 0x10 | uVar40) + 1) << 2;
LAB_0015e5d9:
                            piVar33 = (int *)realloc(local_4208->elem,sVar51);
                            local_4208->elem = piVar33;
                          }
                          local_4208->elem[local_4208->nelems] = iVar18;
                          local_4208->nelems = local_4208->nelems + 1;
                        }
                        uVar40 = local_4208->nelems;
                        if (uVar40 == 0xffffffff) {
                          iVar18 = 0;
LAB_0015e630:
                          uVar39 = uVar40 - 1 >> 1 | uVar40 - 1;
                          uVar39 = uVar39 >> 2 | uVar39;
                          uVar39 = uVar39 >> 4 | uVar39;
                          uVar39 = uVar39 >> 8 | uVar39;
                          if ((int)((uVar39 >> 0x10 | uVar39) + 1) < iVar18) goto LAB_0015e65b;
                        }
                        else {
                          if (uVar40 != 0) {
                            uVar39 = uVar40 >> 1 | uVar40;
                            uVar39 = uVar39 >> 2 | uVar39;
                            uVar39 = uVar39 >> 4 | uVar39;
                            uVar39 = uVar39 >> 8 | uVar39;
                            iVar18 = (uVar39 >> 0x10 | uVar39) + 1;
                            goto LAB_0015e630;
                          }
LAB_0015e65b:
                          if (uVar40 == 0xffffffff) {
                            sVar51 = 0;
                          }
                          else {
                            uVar40 = uVar40 >> 1 | uVar40;
                            uVar40 = uVar40 >> 2 | uVar40;
                            uVar40 = uVar40 >> 4 | uVar40;
                            uVar40 = uVar40 >> 8 | uVar40;
                            sVar51 = (long)(int)((uVar40 >> 0x10 | uVar40) + 1) << 2;
                          }
                          piVar33 = (int *)realloc(local_4208->elem,sVar51);
                          local_4208->elem = piVar33;
                        }
                        pyVar41 = (yo_shape *)local_4208->elem;
                        *(int *)((long)&pyVar41->name + (long)local_4208->nelems * 4) = iStack_4174;
                        local_4208->nelems = local_4208->nelems + 1;
                        uVar54 = uVar54 + 1;
                        bVar48 = false;
                      } while (uVar52 != uVar54);
                    }
                  }
                  else {
                    iVar19 = strcmp(pcVar26,"p");
                    if (iVar19 == 0) {
                      if (local_4208->etype != 1) {
                        local_4208 = yo__flush_shape(scene_00,vhash);
                      }
                      local_4208->etype = 1;
                      if (1 < iVar18) {
                        uVar54 = 1;
                        do {
                          local_4168 = (undefined4 *)CONCAT44(uVar37,uVar38);
                          uStack_415c = 0;
                          uStack_4158 = 0;
                          uStack_4154 = 0;
                          vl_01.norm = (undefined4)local_41d0;
                          vl_01.color = local_41d0._4_4_;
                          vl_01._0_8_ = local_4168;
                          vl_01.radius = 0;
                          vl_01.vid = 0;
                          uStack_4160 = uVar50;
                          yo__parse_vert(&local_4108,(char *)(&local_3038)[uVar54],vhash,vl_01);
                          v_02.norm = local_4108.norm;
                          v_02.color = local_4108.color;
                          v_02.pos = local_4108.pos;
                          v_02.texcoord = local_4108.texcoord;
                          v_02.radius = local_4108.radius;
                          v_02.vid = local_4108.vid;
                          yo__add_shape_vert(local_4208,v_02,local_41c0,local_41c8,local_4200,in_R8,
                                             in_R9);
                          uVar40 = local_4208->nelems;
                          if (uVar40 == 0xffffffff) {
                            iVar18 = 0;
LAB_0015e7e7:
                            uVar39 = uVar40 - 1 >> 1 | uVar40 - 1;
                            uVar39 = uVar39 >> 2 | uVar39;
                            uVar39 = uVar39 >> 4 | uVar39;
                            uVar39 = uVar39 >> 8 | uVar39;
                            if ((int)((uVar39 >> 0x10 | uVar39) + 1) < iVar18) goto LAB_0015e812;
                          }
                          else {
                            if (uVar40 != 0) {
                              uVar39 = uVar40 >> 1 | uVar40;
                              uVar39 = uVar39 >> 2 | uVar39;
                              uVar39 = uVar39 >> 4 | uVar39;
                              uVar39 = uVar39 >> 8 | uVar39;
                              iVar18 = (uVar39 >> 0x10 | uVar39) + 1;
                              goto LAB_0015e7e7;
                            }
LAB_0015e812:
                            if (uVar40 == 0xffffffff) {
                              sVar51 = 0;
                            }
                            else {
                              uVar40 = uVar40 >> 1 | uVar40;
                              uVar40 = uVar40 >> 2 | uVar40;
                              uVar40 = uVar40 >> 4 | uVar40;
                              uVar40 = uVar40 >> 8 | uVar40;
                              sVar51 = (long)(int)((uVar40 >> 0x10 | uVar40) + 1) << 2;
                            }
                            piVar33 = (int *)realloc(local_4208->elem,sVar51);
                            local_4208->elem = piVar33;
                          }
                          pyVar41 = (yo_shape *)local_4208->elem;
                          *(int *)((long)&pyVar41->name + (long)local_4208->nelems * 4) =
                               local_4108.vid;
                          local_4208->nelems = local_4208->nelems + 1;
                          uVar54 = uVar54 + 1;
                          bVar48 = false;
                        } while (uVar52 != uVar54);
                      }
                    }
                    else {
                      iVar19 = strcmp(pcVar26,"o");
                      if (iVar19 == 0) {
                        pyVar41 = yo__flush_shape(scene_00,vhash);
                        pcVar26 = local_3030[0];
                        if (iVar18 < 2) {
                          pcVar26 = (char *)0x0;
                        }
                        pcVar26 = yo__strdup(pcVar26);
                        pyVar41->name = pcVar26;
                        local_4208 = pyVar41;
                        bVar48 = false;
                      }
                      else {
                        iVar19 = strcmp(pcVar26,"g");
                        if (iVar19 == 0) {
                          pyVar41 = yo__flush_shape(scene_00,vhash);
                          pcVar26 = local_3030[0];
                          if (iVar18 < 2) {
                            pcVar26 = (char *)0x0;
                          }
                          pcVar26 = yo__strdup(pcVar26);
                          pyVar41->groupname = pcVar26;
                          local_4208 = pyVar41;
                          bVar48 = false;
                        }
                        else {
                          iVar19 = strcmp(pcVar26,"usemtl");
                          if (iVar19 == 0) {
                            pyVar41 = yo__flush_shape(scene_00,vhash);
                            pcVar26 = local_3030[0];
                            if (iVar18 < 2) {
                              pcVar26 = (char *)0x0;
                            }
                            pcVar26 = yo__strdup(pcVar26);
                            pyVar41->matname = pcVar26;
                            local_4208 = pyVar41;
                            bVar48 = false;
                          }
                          else {
                            dirname = "mtllib";
                            iVar18 = strcmp(pcVar26,"mtllib");
                            if (iVar18 == 0) {
                              yo__split_path((char *)&local_4038,dirname,basename,(char *)pyVar41);
                              strcat((char *)&local_4038,local_3030[0]);
                              pyVar27 = yo__load_mtl(scene_00,(char *)&local_4038);
                              if (pyVar27 == (yo_scene *)0x0) {
                                initScene();
                              }
                              pyVar27 = yo__load_mtl(scene_00,(char *)&local_4038);
                              bVar48 = pyVar27 == (yo_scene *)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0015e097;
            }
            dVar11 = atof(local_3030[0]);
            dVar12 = atof(local_3030[1]);
            dVar13 = atof(local_3030[2]);
            if (uVar50 == 0xffffffff) {
              iVar18 = 0;
LAB_0015dfd9:
              uVar38 = uVar50 - 1 >> 1 | uVar50 - 1;
              uVar38 = uVar38 >> 2 | uVar38;
              uVar38 = uVar38 >> 4 | uVar38;
              uVar38 = uVar38 >> 8 | uVar38;
              if ((int)((uVar38 >> 0x10 | uVar38) + 1) < iVar18) {
                if (uVar50 != 0xffffffff) goto LAB_0015e00d;
                sVar51 = 0;
                goto LAB_0015e041;
              }
            }
            else {
              if (uVar50 != 0) {
                uVar38 = (uint)(local_41d0 >> 1) | uVar50;
                uVar38 = uVar38 >> 2 | uVar38;
                uVar38 = uVar38 >> 4 | uVar38;
                uVar38 = uVar38 >> 8 | uVar38;
                iVar18 = (uVar38 >> 0x10 | uVar38) + 1;
                goto LAB_0015dfd9;
              }
LAB_0015e00d:
              uVar38 = (uint)(local_41d0 >> 1) | uVar50;
              uVar38 = uVar38 >> 2 | uVar38;
              uVar38 = uVar38 >> 4 | uVar38;
              uVar38 = uVar38 >> 8 | uVar38;
              sVar51 = (long)(int)((uVar38 >> 0x10 | uVar38) + 1) * 0xc;
LAB_0015e041:
              local_41c8 = (yo__vec3f *)realloc(local_41c8,sVar51);
            }
            pyVar41 = (yo_shape *)(long)(int)uVar50;
            local_41c8[(long)pyVar41].x = (float)dVar11;
            local_41c8[(long)pyVar41].y = (float)dVar12;
            local_41c8[(long)pyVar41].z = (float)dVar13;
            local_41d0 = (ulong)(uVar50 + 1);
          }
          bVar48 = false;
        }
LAB_0015e097:
        if (bVar48) goto LAB_0015e940;
        pcVar26 = fgets((char *)&local_1038,0x1000,__stream);
      } while (pcVar26 != (char *)0x0);
    }
    yo__flush_shape(scene_00,vhash);
    scene_00->nshapes = scene_00->nshapes + -1;
    fclose(__stream);
    iVar18 = scene_00->nshapes;
    if (0 < (long)iVar18) {
      pyVar41 = scene_00->shapes;
      lVar28 = 0;
      do {
        pyVar41[lVar28].matid = -1;
        pbVar6 = (byte *)pyVar41[lVar28].matname;
        if ((pbVar6 != (byte *)0x0) && (iVar19 = scene_00->nmaterials, 0 < (long)iVar19)) {
          iVar55 = -1;
          lVar56 = 0;
          do {
            if (-1 < iVar55) break;
            pbVar58 = (byte *)scene_00->materials[lVar56].name;
            bVar5 = *pbVar58;
            pbVar53 = pbVar6;
            while (bVar5 != 0) {
              pbVar58 = pbVar58 + 1;
              iVar21 = tolower((int)(char)bVar5);
              iVar22 = tolower((int)(char)*pbVar53);
              if (iVar21 != iVar22) break;
              pbVar53 = pbVar53 + 1;
              bVar5 = *pbVar58;
            }
            iVar21 = tolower((uint)bVar5);
            iVar22 = tolower((uint)*pbVar53);
            if (iVar21 == iVar22) {
              iVar55 = (int)lVar56;
              pyVar41[lVar28].matid = iVar55;
            }
            lVar56 = lVar56 + 1;
          } while (lVar56 != iVar19);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != iVar18);
    }
    iVar18 = scene_00->nenvs;
    if (0 < (long)iVar18) {
      pyVar7 = scene_00->envs;
      lVar28 = 0;
      do {
        pyVar7[lVar28].matid = -1;
        pbVar6 = (byte *)pyVar7[lVar28].matname;
        if ((pbVar6 != (byte *)0x0) && (iVar19 = scene_00->nmaterials, 0 < (long)iVar19)) {
          iVar55 = -1;
          lVar56 = 0;
          do {
            if (-1 < iVar55) break;
            pbVar58 = (byte *)scene_00->materials[lVar56].name;
            bVar5 = *pbVar58;
            pbVar53 = pbVar6;
            while (bVar5 != 0) {
              pbVar58 = pbVar58 + 1;
              iVar21 = tolower((int)(char)bVar5);
              iVar22 = tolower((int)(char)*pbVar53);
              if (iVar21 != iVar22) break;
              pbVar53 = pbVar53 + 1;
              bVar5 = *pbVar58;
            }
            iVar21 = tolower((uint)bVar5);
            iVar22 = tolower((uint)*pbVar53);
            if (iVar21 == iVar22) {
              iVar55 = (int)lVar56;
              pyVar7[lVar28].matid = iVar55;
            }
            lVar56 = lVar56 + 1;
          } while (lVar56 != iVar19);
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != iVar18);
    }
    scene_00->ntextures = 0;
    scene_00->textures = (yo_texture *)0x0;
    if (0 < scene_00->nmaterials) {
      lVar28 = 0;
      do {
        pyVar31 = scene_00->materials;
        local_4038 = (char **)pyVar31[lVar28].ke_txt;
        local_4030 = pyVar31[lVar28].ka_txt;
        local_4028 = pyVar31[lVar28].kd_txt;
        pcStack_4020 = pyVar31[lVar28].ks_txt;
        local_4018 = pyVar31[lVar28].kr_txt;
        local_4010 = pyVar31[lVar28].kt_txt;
        local_4008 = pyVar31[lVar28].ns_txt;
        local_4000 = pyVar31[lVar28].op_txt;
        local_3ff8 = pyVar31[lVar28].op_txt;
        local_3ff0 = pyVar31[lVar28].ior_txt;
        local_3fe8 = pyVar31[lVar28].bump_txt;
        local_3fe0 = pyVar31[lVar28].disp_txt;
        local_40c8._M_dataplus._M_p = (pointer)&pyVar31[lVar28].ke_txtid;
        local_40c8._M_string_length = (size_type)&pyVar31[lVar28].ka_txtid;
        local_40c8.field_2._M_allocated_capacity = (size_type)&pyVar31[lVar28].kd_txtid;
        local_40c8.field_2._8_8_ = &pyVar31[lVar28].ks_txtid;
        local_40a8 = &pyVar31[lVar28].kr_txtid;
        local_40a0 = &pyVar31[lVar28].kt_txtid;
        local_4098 = &pyVar31[lVar28].ns_txtid;
        local_4090 = &pyVar31[lVar28].op_txtid;
        local_4088 = &pyVar31[lVar28].op_txtid;
        local_4080 = &pyVar31[lVar28].ior_txtid;
        local_4078 = &pyVar31[lVar28].bump_txtid;
        local_4070 = &pyVar31[lVar28].disp_txtid;
        lVar56 = 0;
        do {
          ppcVar44 = (&local_4038)[lVar56];
          if (ppcVar44 == (char **)0x0) {
            iVar18 = -1;
          }
          else {
            uVar38 = scene_00->ntextures;
            if ((long)(int)uVar38 < 1) {
              cVar17 = '\x01';
              iVar18 = -1;
            }
            else {
              pyVar29 = scene_00->textures;
              uVar54 = 1;
              uVar52 = 0xffffffff;
              do {
                iVar18 = strcmp((char *)ppcVar44,pyVar29->path);
                uVar57 = (ulong)((int)uVar54 - 1);
                if (iVar18 != 0) {
                  uVar57 = uVar52;
                }
                iVar18 = (int)uVar57;
                cVar17 = (char)(uVar57 >> 0x1f);
                if ((ulong)(long)(int)uVar38 <= uVar54) break;
                uVar54 = uVar54 + 1;
                pyVar29 = pyVar29 + 1;
                uVar52 = uVar57;
              } while (iVar18 < 0);
            }
            if (cVar17 != '\0') {
              if (uVar38 == 0xffffffff) {
                iVar18 = 0;
LAB_0015ede3:
                uVar37 = uVar38 - 1 >> 1 | uVar38 - 1;
                uVar37 = uVar37 >> 2 | uVar37;
                uVar37 = uVar37 >> 4 | uVar37;
                uVar37 = uVar37 >> 8 | uVar37;
                if ((int)((uVar37 >> 0x10 | uVar37) + 1) < iVar18) goto LAB_0015ee14;
              }
              else {
                if (uVar38 != 0) {
                  uVar37 = uVar38 >> 1 | uVar38;
                  uVar37 = uVar37 >> 2 | uVar37;
                  uVar37 = uVar37 >> 4 | uVar37;
                  uVar37 = uVar37 >> 8 | uVar37;
                  iVar18 = (uVar37 >> 0x10 | uVar37) + 1;
                  goto LAB_0015ede3;
                }
LAB_0015ee14:
                if (uVar38 == 0xffffffff) {
                  sVar51 = 0;
                }
                else {
                  uVar38 = uVar38 >> 1 | uVar38;
                  uVar38 = uVar38 >> 2 | uVar38;
                  uVar38 = uVar38 >> 4 | uVar38;
                  uVar38 = uVar38 >> 8 | uVar38;
                  sVar51 = (long)(int)((uVar38 >> 0x10 | uVar38) + 1) << 5;
                }
                pyVar29 = (yo_texture *)realloc(scene_00->textures,sVar51);
                scene_00->textures = pyVar29;
                uVar38 = scene_00->ntextures;
                if ((long)(int)uVar38 == -1) {
                  iVar18 = 0;
                }
                else {
                  uVar37 = uVar38 >> 1 | uVar38;
                  uVar37 = uVar37 >> 2 | uVar37;
                  uVar37 = uVar37 >> 4 | uVar37;
                  uVar37 = uVar37 >> 8 | uVar37;
                  iVar18 = (uVar37 >> 0x10 | uVar37) + 1;
                }
                memset(pyVar29 + (int)uVar38,0,(long)(int)(iVar18 - uVar38) << 5);
              }
              iVar18 = scene_00->ntextures;
              scene_00->ntextures = iVar18 + 1;
              pyVar29 = scene_00->textures;
              sVar51 = strlen((char *)ppcVar44);
              pcVar26 = (char *)calloc(sVar51 + 1,1);
              strcpy(pcVar26,(char *)ppcVar44);
              pyVar29[iVar18].path = pcVar26;
            }
          }
          *(int *)(&local_40c8._M_dataplus)[lVar56]._M_p = iVar18;
          lVar56 = lVar56 + 1;
        } while (lVar56 != 0xc);
        lVar28 = lVar28 + 1;
      } while (lVar28 < scene_00->nmaterials);
    }
    lVar28 = 0x80001;
    do {
      if (*(void **)(vhash->s + lVar28 * 2 + -1) != (void *)0x0) {
        free(*(void **)(vhash->s + lVar28 * 2 + -1));
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x180001);
    free(vhash);
    if (local_41c0 != (yo__vec3f *)0x0) {
      free(local_41c0);
    }
    if (local_41c8 != (yo__vec3f *)0x0) {
      free(local_41c8);
    }
    if (local_4200 != (yo__vec2f *)0x0) {
      free(local_4200);
    }
    if (scene_00->cameras != (yo_camera *)0x0) {
      pyVar30 = (yo_camera *)realloc(scene_00->cameras,(long)scene_00->ncameras * 0x38);
      scene_00->cameras = pyVar30;
    }
    if (scene_00->shapes != (yo_shape *)0x0) {
      pyVar41 = (yo_shape *)realloc(scene_00->shapes,(long)scene_00->nshapes * 0x60);
      scene_00->shapes = pyVar41;
    }
    if (scene_00->materials != (yo_material *)0x0) {
      pyVar31 = (yo_material *)realloc(scene_00->materials,(long)scene_00->nmaterials * 0xe8);
      scene_00->materials = pyVar31;
    }
    if (scene_00->textures != (yo_texture *)0x0) {
      pyVar29 = (yo_texture *)realloc(scene_00->textures,(long)scene_00->ntextures << 5);
      scene_00->textures = pyVar29;
    }
  }
  if ((scene_00 == (yo_scene *)0x0) || (scene_00->nshapes == 0)) {
    puVar46 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar46 = "Error loading obj file";
    __cxa_throw(puVar46,&char_const*::typeinfo,0);
  }
  github111116::ConsoleLogger::log<int,char[7]>(&console,&scene_00->nshapes,(char (*) [7])"shapes");
  (scene->mesh).vertices = 0;
  iVar18 = scene_00->nshapes;
  if (0 < (long)iVar18) {
    iVar19 = (scene->mesh).vertices;
    lVar28 = 0;
    do {
      iVar19 = iVar19 + *(int *)((long)&scene_00->shapes->nelems + lVar28) * 3;
      lVar28 = lVar28 + 0x60;
    } while ((long)iVar18 * 0x60 != lVar28);
    (scene->mesh).vertices = iVar19;
  }
  upload_albedo_map(iVar18,texture_file_abi_cxx11_);
  sVar51 = (size_t)(scene->mesh).vertices;
  positions = (vec3f *)calloc(sVar51,0xc);
  pvVar32 = calloc(sVar51,8);
  normal = (vec3f *)calloc(sVar51,0xc);
  __src = calloc(sVar51,4);
  piVar33 = (int *)calloc(sVar51,4);
  sphcnt = (int *)calloc(sVar51,4);
  LHbuffer = (float *)calloc(sVar51,900);
  local_3038 = (char **)((ulong)local_3038._4_4_ << 0x20);
  if (0 < scene_00->nshapes) {
    iVar18 = 0;
    iVar19 = 0;
    do {
      pyVar41 = scene_00->shapes;
      if ((enable_texture[iVar19] == true) && (pyVar41[iVar19].texcoord == (float *)0x0)) {
        github111116::ConsoleLogger::error<char[6],int,char[39]>
                  (&console,(char (*) [6])"Shape",(int *)&local_3038,
                   (char (*) [39])"is texture-enabled but has no texcoord");
      }
      uVar38 = pyVar41[iVar19].nelems * 3;
      if (0 < pyVar41[iVar19].nelems) {
        piVar8 = pyVar41[iVar19].elem;
        pfVar9 = pyVar41[iVar19].pos;
        pfVar10 = pyVar41[iVar19].norm;
        bVar48 = enable_texture[(int)local_3038];
        lVar28 = (long)iVar18;
        uVar52 = 1;
        if (1 < (int)uVar38) {
          uVar52 = (ulong)uVar38;
        }
        lVar56 = lVar28 * 0xc;
        lVar34 = 0;
        do {
          lVar49 = (long)*(int *)((long)piVar8 + lVar34);
          *(float *)((long)&positions->z + lVar56) = pfVar9[lVar49 * 3 + 2];
          *(undefined8 *)((long)&positions->x + lVar56) = *(undefined8 *)(pfVar9 + lVar49 * 3);
          *(float *)((long)&normal->z + lVar56) = pfVar10[lVar49 * 3 + 2];
          *(undefined8 *)((long)&normal->x + lVar56) = *(undefined8 *)(pfVar10 + lVar49 * 3);
          if (bVar48 == false) {
            uVar59 = 0xbf800000bf800000;
          }
          else {
            uVar59 = *(undefined8 *)(pyVar41[iVar19].texcoord + lVar49 * 2);
          }
          *(undefined8 *)((long)pvVar32 + lVar34 * 2 + lVar28 * 8) = uVar59;
          *(int *)((long)__src + lVar34 + lVar28 * 4) = (int)local_3038;
          lVar56 = lVar56 + 0xc;
          lVar34 = lVar34 + 4;
        } while (uVar52 * 4 != lVar34);
      }
      iVar18 = iVar18 + uVar38;
      iVar19 = (int)local_3038 + 1;
      local_3038 = (char **)CONCAT44(local_3038._4_4_,iVar19);
    } while (iVar19 < scene_00->nshapes);
  }
  if (0 < scene_00->ncameras) {
    lVar28 = 0;
    lVar56 = 0;
    do {
      pvVar35 = *(void **)((long)scene_00->cameras->from + lVar28 + -8);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      lVar56 = lVar56 + 1;
      lVar28 = lVar28 + 0x38;
    } while (lVar56 < scene_00->ncameras);
  }
  if (0 < scene_00->nshapes) {
    lVar28 = 0x40;
    lVar56 = 0;
    do {
      pyVar41 = scene_00->shapes;
      pvVar35 = *(void **)((long)pyVar41 + lVar28 + -0x40);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)pyVar41 + lVar28 + -0x30);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)pyVar41 + lVar28 + -0x20);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)pyVar41 + lVar28 + -0x10);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)pyVar41 + lVar28 + -8);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)&pyVar41->name + lVar28);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      lVar56 = lVar56 + 1;
      lVar28 = lVar28 + 0x60;
    } while (lVar56 < scene_00->nshapes);
  }
  if (0 < scene_00->nmaterials) {
    lVar28 = 0;
    do {
      pyVar31 = scene_00->materials;
      if (pyVar31[lVar28].name != (char *)0x0) {
        free(pyVar31[lVar28].name);
      }
      local_3038 = (char **)pyVar31[lVar28].ke_txt;
      local_3030[0] = pyVar31[lVar28].ka_txt;
      local_3030[1] = pyVar31[lVar28].kd_txt;
      local_3030[2] = pyVar31[lVar28].ks_txt;
      local_3030[3] = pyVar31[lVar28].kr_txt;
      local_3010 = pyVar31[lVar28].kt_txt;
      local_3008 = pyVar31[lVar28].ns_txt;
      local_3000 = pyVar31[lVar28].op_txt;
      local_2ff8 = pyVar31[lVar28].bump_txt;
      local_2ff0 = pyVar31[lVar28].disp_txt;
      lVar56 = 0;
      do {
        if ((void *)(&local_3038)[lVar56] != (void *)0x0) {
          free((void *)(&local_3038)[lVar56]);
        }
        lVar56 = lVar56 + 1;
      } while (lVar56 != 10);
      lVar28 = lVar28 + 1;
    } while (lVar28 < scene_00->nmaterials);
  }
  if (0 < scene_00->nenvs) {
    lVar28 = 8;
    lVar56 = 0;
    do {
      pyVar7 = scene_00->envs;
      pvVar35 = *(void **)((long)pyVar7->from + lVar28 + -0x1c);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)pyVar7->from + lVar28 + -0x14);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      lVar56 = lVar56 + 1;
      lVar28 = lVar28 + 0x38;
    } while (lVar56 < scene_00->nenvs);
  }
  if (0 < scene_00->ntextures) {
    lVar28 = 0;
    lVar56 = 0;
    do {
      pyVar29 = scene_00->textures;
      pvVar35 = *(void **)((long)&pyVar29->path + lVar28);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      pvVar35 = *(void **)((long)&pyVar29->pixels + lVar28);
      if (pvVar35 != (void *)0x0) {
        free(pvVar35);
      }
      lVar56 = lVar56 + 1;
      lVar28 = lVar28 + 0x20;
    } while (lVar56 < scene_00->ntextures);
  }
  cluster_points((scene->mesh).vertices,positions,piVar33);
  cluster_preprocess((scene->mesh).vertices,positions,piVar33,&local_4060,sphcnt);
  calculateLH((scene->mesh).vertices,positions,normal,LHbuffer,"../res/scene1/light7.obj");
  uploadLH((scene->mesh).vertices,LHbuffer);
  github111116::ConsoleLogger::log<char[25]>(&console,(char (*) [25])"renderer initializing...");
  pGVar1 = &(scene->mesh).vao;
  (*glad_glGenVertexArrays)(1,pGVar1);
  (*glad_glBindVertexArray)(*pGVar1);
  pGVar1 = &(scene->mesh).vbo;
  (*glad_glGenBuffers)(1,pGVar1);
  (*glad_glBindBuffer)(0x8892,*pGVar1);
  (*glad_glBufferData)(0x8892,sVar51 * 0x2c,(void *)0x0,0x88e4);
  pvVar35 = (*glad_glMapBuffer)(0x8892,0x88b9);
  if (pvVar35 == (void *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/main.cpp"
                  ,0xbd,"void initScene(scene_t *)");
  }
  __n = sVar51 * 4;
  __n_00 = (void *)(sVar51 * 0xc);
  memcpy(pvVar35,positions,(size_t)__n_00);
  memcpy((void *)((long)pvVar35 + (long)__n_00),pvVar32,sVar51 * 8);
  pvVar32 = (void *)((long)pvVar35 + (long)__n_00 + sVar51 * 8);
  memcpy(pvVar32,normal,(size_t)__n_00);
  pvVar32 = (void *)((long)pvVar32 + (long)__n_00);
  memcpy(pvVar32,__src,__n);
  pvVar32 = (void *)((long)pvVar32 + __n);
  memcpy(pvVar32,piVar33,__n);
  memcpy((void *)((long)pvVar32 + __n),sphcnt,__n);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0,__n_00);
  (*glad_glEnableVertexAttribArray)(2);
  (*glad_glVertexAttribPointer)(2,3,0x1406,'\0',0,(void *)(sVar51 * 0x14));
  (*glad_glEnableVertexAttribArray)(3);
  (*glad_glVertexAttribIPointer)(3,1,0x1404,0,(void *)(sVar51 << 5));
  (*glad_glEnableVertexAttribArray)(4);
  (*glad_glVertexAttribIPointer)(4,1,0x1404,0,(void *)(sVar51 * 0x24));
  (*glad_glEnableVertexAttribArray)(5);
  (*glad_glVertexAttribIPointer)(5,1,0x1404,0,(void *)(sVar51 * 0x28));
  free(positions);
  free(normal);
  free(__src);
  free(piVar33);
  free(sphcnt);
  free(LHbuffer);
  local_3038 = local_3030 + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3038,"0","");
  iVar18 = 0xe0;
  do {
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1038,local_3038,local_3030[0] + (long)local_3038);
    std::__cxx11::string::append((char *)&local_1038);
    std::__cxx11::string::operator=((string *)&local_3038,(string *)&local_1038);
    if (local_1038 != &local_1028) {
      operator_delete(local_1038);
    }
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
  local_4168 = &uStack_4158;
  std::__cxx11::string::_M_construct((ulong)&local_4168,'\x02');
  *(undefined2 *)local_4168 = 0x3531;
  plVar36 = (long *)std::__cxx11::string::replace((ulong)&local_4168,0,(char *)0x0,0x199ea8);
  local_4108._0_8_ = &local_4108.radius;
  plVar42 = plVar36 + 2;
  if ((long *)*plVar36 == plVar42) {
    local_4108._16_8_ = *plVar42;
    lStack_40f0 = plVar36[3];
  }
  else {
    local_4108._16_8_ = *plVar42;
    local_4108._0_8_ = (long *)*plVar36;
  }
  local_4108._8_8_ = plVar36[1];
  *plVar36 = (long)plVar42;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  plVar36 = (long *)std::__cxx11::string::append((char *)&local_4108);
  plVar42 = plVar36 + 2;
  if ((long *)*plVar36 == plVar42) {
    lStack_4190 = plVar36[3];
    uStack_4198 = (undefined4)*plVar42;
    uStack_4194 = (undefined4)((ulong)*plVar42 >> 0x20);
    local_41a8 = &uStack_4198;
  }
  else {
    uStack_4198 = (undefined4)*plVar42;
    uStack_4194 = (undefined4)((ulong)*plVar42 >> 0x20);
    local_41a8 = (undefined4 *)*plVar36;
  }
  uStack_41a0 = (uint)plVar36[1];
  uStack_419c = (undefined4)((ulong)plVar36[1] >> 0x20);
  *plVar36 = (long)plVar42;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  local_40e8 = local_40d8;
  std::__cxx11::string::_M_construct((ulong)&local_40e8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40e8,3,0xe1);
  uVar52 = local_40e0 + CONCAT44(uStack_419c,uStack_41a0);
  uVar54 = 0xf;
  if (local_41a8 != &uStack_4198) {
    uVar54 = CONCAT44(uStack_4194,uStack_4198);
  }
  if (uVar54 < uVar52) {
    uVar54 = 0xf;
    if (local_40e8 != local_40d8) {
      uVar54 = local_40d8[0];
    }
    if (uVar52 <= uVar54) {
      puVar46 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_40e8,0,(char *)0x0,(ulong)local_41a8);
      goto LAB_0015f952;
    }
  }
  puVar46 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_41a8,(ulong)local_40e8);
LAB_0015f952:
  local_4188[0] = &((yo__vert *)local_4188)->radius;
  puVar2 = puVar46 + 2;
  if ((int *)*puVar46 == (int *)puVar2) {
    _local_4178 = *puVar2;
    uStack_4170 = puVar46[3];
  }
  else {
    _local_4178 = *puVar2;
    local_4188[0] = (int *)*puVar46;
  }
  local_4188[1] = (int *)puVar46[1];
  *puVar46 = puVar2;
  puVar46[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar36 = (long *)std::__cxx11::string::append((char *)local_4188);
  plVar42 = plVar36 + 2;
  if ((long *)*plVar36 == plVar42) {
    lStack_4110 = plVar36[3];
    uStack_4118 = (undefined4)*plVar42;
    uStack_4114 = (undefined4)((ulong)*plVar42 >> 0x20);
    local_4128 = &uStack_4118;
  }
  else {
    uStack_4118 = (undefined4)*plVar42;
    uStack_4114 = (undefined4)((ulong)*plVar42 >> 0x20);
    local_4128 = (undefined4 *)*plVar36;
  }
  uStack_4120 = (uint)plVar36[1];
  uStack_411c = (undefined4)((ulong)plVar36[1] >> 0x20);
  *plVar36 = (long)plVar42;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  plVar36 = (long *)std::__cxx11::string::_M_append((char *)&local_4128,(ulong)local_3038);
  paVar3 = &local_4148.field_2;
  psVar43 = (size_type *)(plVar36 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar36 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar43) {
    local_4148.field_2._M_allocated_capacity = *psVar43;
    local_4148.field_2._8_8_ = plVar36[3];
    local_4148._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_4148.field_2._M_allocated_capacity = *psVar43;
    local_4148._M_dataplus._M_p = (pointer)*plVar36;
  }
  local_4148._M_string_length = plVar36[1];
  *plVar36 = (long)psVar43;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  plVar36 = (long *)std::__cxx11::string::append((char *)&local_4148);
  paVar4 = &local_40c8.field_2;
  psVar43 = (size_type *)(plVar36 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar36 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar43) {
    local_40c8.field_2._M_allocated_capacity = *psVar43;
    local_40c8.field_2._8_8_ = plVar36[3];
    local_40c8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_40c8.field_2._M_allocated_capacity = *psVar43;
    local_40c8._M_dataplus._M_p = (pointer)*plVar36;
  }
  local_40c8._M_string_length = plVar36[1];
  *plVar36 = (long)psVar43;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  plVar36 = (long *)std::__cxx11::string::append((char *)&local_40c8);
  ppcVar44 = (char **)(plVar36 + 2);
  if ((char **)*plVar36 == ppcVar44) {
    local_4028 = *ppcVar44;
    pcStack_4020 = (char *)plVar36[3];
    local_4038 = &local_4028;
  }
  else {
    local_4028 = *ppcVar44;
    local_4038 = (char **)*plVar36;
  }
  local_4030 = (char *)plVar36[1];
  *plVar36 = (long)ppcVar44;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  plVar36 = (long *)std::__cxx11::string::append((char *)&local_4038);
  plVar42 = plVar36 + 2;
  if ((long *)*plVar36 == plVar42) {
    local_1028 = *plVar42;
    lStack_1020 = plVar36[3];
    local_1038 = &local_1028;
  }
  else {
    local_1028 = *plVar42;
    local_1038 = (long *)*plVar36;
  }
  local_1030 = plVar36[1];
  *plVar36 = (long)plVar42;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  if (local_4038 != &local_4028) {
    operator_delete(local_4038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_40c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4148._M_dataplus._M_p != paVar3) {
    operator_delete(local_4148._M_dataplus._M_p);
  }
  if (local_4128 != &uStack_4118) {
    operator_delete(local_4128);
  }
  if (local_4188[0] != &((yo__vert *)local_4188)->radius) {
    operator_delete(local_4188[0]);
  }
  if (local_40e8 != local_40d8) {
    operator_delete(local_40e8);
  }
  if (local_41a8 != &uStack_4198) {
    operator_delete(local_41a8);
  }
  if ((int *)local_4108._0_8_ != &local_4108.radius) {
    operator_delete((void *)local_4108._0_8_);
  }
  if (local_4168 != &uStack_4158) {
    operator_delete(local_4168);
  }
  readfile_abi_cxx11_(&local_40c8,"../shaders/vert.glsl");
  plVar36 = (long *)std::__cxx11::string::replace
                              ((ulong)&local_40c8,0,(char *)0x0,(ulong)local_1038);
  ppcVar44 = (char **)(plVar36 + 2);
  if ((char **)*plVar36 == ppcVar44) {
    local_4028 = *ppcVar44;
    pcStack_4020 = (char *)plVar36[3];
    local_4038 = &local_4028;
  }
  else {
    local_4028 = *ppcVar44;
    local_4038 = (char **)*plVar36;
  }
  vp = local_4038;
  local_4030 = (char *)plVar36[1];
  *plVar36 = (long)ppcVar44;
  plVar36[1] = 0;
  *(undefined1 *)(plVar36 + 2) = 0;
  readfile_abi_cxx11_(&local_4148,"../shaders/frag.glsl");
  GVar23 = s_loadProgram((char *)vp,local_4148._M_dataplus._M_p,&PTR_anon_var_dwarf_3d870_001b6ab0,6
                        );
  (scene->mesh).program = GVar23;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4148._M_dataplus._M_p != paVar3) {
    operator_delete(local_4148._M_dataplus._M_p);
  }
  if (local_4038 != &local_4028) {
    operator_delete(local_4038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_40c8._M_dataplus._M_p);
  }
  GVar23 = (scene->mesh).program;
  if (GVar23 != 0) {
    GVar24 = (*glad_glGetUniformLocation)(GVar23,"u_view");
    (scene->mesh).u_view = GVar24;
    GVar24 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_projection");
    (scene->mesh).u_projection = GVar24;
    if (local_1038 != &local_1028) {
      operator_delete(local_1038);
    }
    if (local_3038 != local_3030 + 1) {
      operator_delete(local_3038);
    }
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_4060.child);
    return;
  }
  puVar46 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar46 = "Error loading mesh shader";
  __cxa_throw(puVar46,&char_const*::typeinfo,0);
}

Assistant:

static void initScene(scene_t *scene)
{
	SphereTree hierarchy = load_sphere_hierarchy(sphere_file);
	buildLHcubemap(sh_light_file);
	loadlut(3, scene->mesh.max_magn);
	build_sh_lut();
	scene->mesh.gammasize = upload_gamma(shorder);
	scene->mesh.sqrgammasize = upload_sqrgamma(shorder);
	console.log("gamma size:", scene->mesh.gammasize);
	console.log("sqrgamma size:", scene->mesh.sqrgammasize);

	// mesh
	console.log("loading scene...");
	yo_scene *yo = yo_load_obj(obj_file, true, false);
	if (!yo || !yo->nshapes)
		throw "Error loading obj file";
	console.log(yo->nshapes, "shapes");

	scene->mesh.vertices = 0;
	for (int i = 0; i < yo->nshapes; i++)
		scene->mesh.vertices += yo->shapes[i].nelems * 3;

	// load model texture
	upload_albedo_map(yo->nshapes, texture_file);

	// alloc host space for attributes
	m_vec3 *positions = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	m_vec2 *texcoords = (m_vec2*)calloc(scene->mesh.vertices, sizeof(m_vec2));
	m_vec3 *normals   = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	int *objids       = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *clusterids   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *sphcnt   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	// Note: LH isn't uploaded as vertex attribute
	float *LH = (float*)calloc(scene->mesh.vertices, N_COEFFS * sizeof(float));
	// total size of each attribute
	size_t positionsSize  = scene->mesh.vertices * sizeof(m_vec3);
	size_t texcoordsSize  = scene->mesh.vertices * sizeof(m_vec2);
	size_t normalsSize    = scene->mesh.vertices * sizeof(m_vec3);
	size_t objidsSize     = scene->mesh.vertices * sizeof(int);
	size_t clusteridsSize = scene->mesh.vertices * sizeof(int);
	size_t sphcntSize     = scene->mesh.vertices * sizeof(int);
	size_t LHSize         = scene->mesh.vertices * N_COEFFS * sizeof(float);

	// fill positions & normals from scene
	int n = 0;
	for (int i = 0; i < yo->nshapes; i++)
	{
		yo_shape *shape = yo->shapes + i;
		if (enable_texture[i] && !shape->texcoord)
			console.error("Shape",i,"is texture-enabled but has no texcoord");
		for (int j = 0; j < shape->nelems * 3; j++)
		{
			positions[n + j] = *(m_vec3*)&shape->pos[shape->elem[j] * 3];
			normals[n + j] = *(m_vec3*)&shape->norm[shape->elem[j] * 3];
			if (enable_texture[i])
				texcoords[n + j] = *(m_vec2*)&shape->texcoord[shape->elem[j] * 2];
			else
				texcoords[n + j] = m_vec2{-1,-1};
			objids[n + j] = i;
		}
		n += shape->nelems * 3;
	}
	yo_free_scene(yo);
	// cluster receiver
	cluster_points(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids);
	cluster_preprocess(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids, hierarchy, sphcnt);
	// preprocess lighting
	if (obj_light_enabled)
		calculateLH(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), reinterpret_cast<vec3f*>(normals), LH, obj_light_file);
	else
		memset(LH, 0, LHSize);
	// because openGL doesn't support array as attribute, we upload it as texture
	uploadLH(scene->mesh.vertices, LH);

	console.log("renderer initializing...");
	// upload geometry to opengl
	glGenVertexArrays(1, &scene->mesh.vao);
	glBindVertexArray(scene->mesh.vao);
	// upload attribute data
	glGenBuffers(1, &scene->mesh.vbo);
	glBindBuffer(GL_ARRAY_BUFFER, scene->mesh.vbo);
	glBufferData(GL_ARRAY_BUFFER, positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize, NULL, GL_STATIC_DRAW);
	unsigned char *buffer = (unsigned char*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	assert(buffer);
	memcpy(buffer, positions, positionsSize);
	memcpy(buffer + positionsSize, texcoords, texcoordsSize);
	memcpy(buffer + positionsSize + texcoordsSize, normals, normalsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize, objids, objidsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize, clusterids, clusteridsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize, sphcnt, sphcntSize);
	glUnmapBuffer(GL_ARRAY_BUFFER);

	// set attribute pointers
	glEnableVertexAttribArray(0);
	glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, (void*)0);
	glEnableVertexAttribArray(1);
	glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, (void*)positionsSize);
	glEnableVertexAttribArray(2);
	glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, 0, (void*)(positionsSize + texcoordsSize));
	glEnableVertexAttribArray(3);
	glVertexAttribIPointer(3, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize));
	glEnableVertexAttribArray(4);
	glVertexAttribIPointer(4, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize));
	glEnableVertexAttribArray(5);
	glVertexAttribIPointer(5, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize));

	// free host space
	free(positions);
	free(normals);
	free(objids);
	free(clusterids);
	free(sphcnt);
	free(LH);

	const char *attribs[] =
	{
		"a_position",
		"a_texcoord",
		"a_normal",
		"a_objid",
		"a_clusterid",
		"a_sphcnt"
	};
	std::string N_ZEROS = "0";
	for (int i=1; i<N_COEFFS; ++i)
		N_ZEROS = N_ZEROS + ",0";
	std::string vert_head = "#version 410 core\n"
	"#define sh_order " + std::to_string(shorder) + "\n"
	"#define N " + std::to_string(shorder * shorder) + "\n"
	"#define N_ZEROS " + N_ZEROS + "\n"
	"#define SHEXP_METHOD " + SHEXP_METHOD + "\n";
	scene->mesh.program = s_loadProgram((vert_head + readfile(vert_shader_path)).c_str(), readfile(frag_shader_path).c_str(), attribs, 6);
	if (!scene->mesh.program)
		throw "Error loading mesh shader";
	scene->mesh.u_view = glGetUniformLocation(scene->mesh.program, "u_view");
	scene->mesh.u_projection = glGetUniformLocation(scene->mesh.program, "u_projection");
}